

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgBan.c
# Opt level: O3

void zvgBanner(uint *speeds,ZvgID_s *id)

{
  uint uVar1;
  FILE *pFVar2;
  ulong in_RAX;
  char *pcVar3;
  uint monFlags;
  uint port;
  undefined8 local_38;
  
  local_38 = in_RAX;
  zvgGetPortInfo((uint *)((long)&local_38 + 4),(uint *)&local_38);
  uVar1 = *(uint *)((long)speeds + (ulong)(id->sws >> 2 & 0xc));
  fprintf(_stdout,"\nZVG found on PORT=%03X, ",local_38 >> 0x20);
  fputs("\n\nFirmware Version:",_stdout);
  pFVar2 = _stdout;
  sVer(id->fVer);
  fprintf(pFVar2,"\n   Controller:   %s",sVer::verStr);
  pFVar2 = _stdout;
  sVer(id->bVer);
  fprintf(pFVar2,"\n   Bootloader:   %s",sVer::verStr);
  pFVar2 = _stdout;
  sVer(id->vVer);
  fprintf(pFVar2,"\n   Vector Timer: %s",sVer::verStr);
  fprintf(_stdout,"\n\nMonitor Settings (%u): ",local_38 & 0xffffffff);
  fputs("\n   Type:           ",_stdout);
  pcVar3 = "B&W";
  if ((local_38 & 8) == 0) {
    pcVar3 = "Color";
  }
  fputs(pcVar3,_stdout);
  fputs("\n   Spotkill Logic: ",_stdout);
  pcVar3 = "Enabled";
  if ((local_38 & 4) == 0) {
    pcVar3 = "Disabled";
  }
  fputs(pcVar3,_stdout);
  fputs("\n   Orientation:    ",_stdout);
  if ((~(uint)local_38 & 3) == 0) {
    pcVar3 = "Flip X and Y axes";
  }
  else if ((local_38 & 1) == 0) {
    if ((local_38 & 2) == 0) {
      pcVar3 = "Do not flip X or Y axes";
    }
    else {
      pcVar3 = "Flip Y axis";
    }
  }
  else {
    pcVar3 = "Flip X axis";
  }
  fputs(pcVar3,_stdout);
  fputs("\n   Overscan:       ",_stdout);
  pcVar3 = "Do not overscan monitor";
  if ((local_38 & 0x10) == 0) {
    pcVar3 = "Overscanning allowed";
  }
  fputs(pcVar3,_stdout);
  fprintf(_stdout,"\n   Speed:          %uus per inch",(ulong)uVar1);
  fflush(_stdout);
  return;
}

Assistant:

void zvgBanner( ZvgSpeeds_a speeds, ZvgID_s *id)
{
	uint	port, monFlags;
	//uint	dma, dmaMode, irq;
	uint	monSpeed;

	// get port stuff

	zvgGetPortInfo( &port, &monFlags);

	// lookup monitor speed in speed table based on switch settings

	monSpeed = speeds[(id->sws >> 4) & 0x03];

	// print banner

	fprintf( stdout, "\nZVG found on PORT=%03X, ", port);

	//if (dmaMode != 0)
	//	fprintf( stdout, "DMA=%u, DMA Mode=%u, IRQ=%u.", dma, dmaMode, irq);

	//else
	//	fputs( "Using polled mode (DMA disabled).", stdout);

	fputs( "\n\nFirmware Version:", stdout);

	fprintf( stdout, "\n   Controller:   %s", sVer( id->fVer));
	fprintf( stdout, "\n   Bootloader:   %s", sVer( id->bVer));
	fprintf( stdout, "\n   Vector Timer: %s", sVer( id->vVer));

	fprintf( stdout, "\n\nMonitor Settings (%u): ", monFlags);
	fputs( "\n   Type:           ", stdout);

	if (monFlags & MONF_BW)
		fputs( "B&W", stdout);

	else
		fputs( "Color", stdout);

	fputs( "\n   Spotkill Logic: ", stdout);

	if (monFlags & MONF_SPOTKILL)
		fputs( "Enabled", stdout);

	else
		fputs( "Disabled", stdout);

	fputs( "\n   Orientation:    ", stdout);

	if ((monFlags & MONF_FLIPX) && (monFlags & MONF_FLIPY))
		fputs( "Flip X and Y axes", stdout);

	else if (monFlags & MONF_FLIPX)
		fputs( "Flip X axis", stdout);

	else if (monFlags & MONF_FLIPY)
		fputs( "Flip Y axis", stdout);

	else
		fputs( "Do not flip X or Y axes", stdout);

	fputs( "\n   Overscan:       ", stdout);

	if (monFlags & MONF_NOOVS)
		fputs( "Do not overscan monitor", stdout);

	else
		fputs( "Overscanning allowed", stdout);

	fprintf( stdout, "\n   Speed:          %uus per inch", monSpeed);

	fflush( stdout);
}